

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O3

void __thiscall xray_re::xr_ini_writer::open_section(xr_ini_writer *this,string *format,...)

{
  _Map_pointer ppbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  char in_AL;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type *psVar8;
  long *plVar9;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string section;
  string prev_section;
  va_list ap;
  char buf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  long *local_558;
  long local_550;
  long local_548;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528;
  undefined7 uStack_527;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined8 local_4f8;
  size_type *local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [16];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1032];
  
  local_4e8 = local_4d8;
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Da;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_4f0 = &section._M_string_length;
  local_4f8 = 0x3000000010;
  local_4c8 = in_RDX;
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  iVar4 = vsnprintf(local_428,0x400,(format->_M_dataplus)._M_p,&local_4f8);
  if (iVar4 != 0) {
    local_530 = 0;
    local_528 = 0;
    ppbVar1 = (this->m_section_stack).c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pbVar7 = (this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pbVar2 = (this->m_section_stack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_538 = &local_528;
    if (((long)(this->m_section_stack).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->m_section_stack).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
        ((long)pbVar7 - (long)pbVar2 >> 5) +
        ((((ulong)((long)ppbVar1 -
                  (long)(this->m_section_stack).c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppbVar1 == (_Map_pointer)0x0)) * 0x10 != 0) {
      if (pbVar7 == pbVar2) {
        pbVar7 = ppbVar1[-1] + 0x10;
      }
      pcVar3 = pbVar7[-1]._M_dataplus._M_p;
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,pcVar3,pcVar3 + pbVar7[-1]._M_string_length);
      std::__cxx11::string::append((char *)&local_578);
      std::__cxx11::string::operator=((string *)&local_538,(string *)&local_578);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
    }
    local_558 = &local_548;
    sVar5 = strlen(local_428);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,local_428,local_428 + sVar5);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_538)
    ;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_578.field_2._M_allocated_capacity = *psVar8;
      local_578.field_2._8_8_ = plVar6[3];
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    }
    else {
      local_578.field_2._M_allocated_capacity = *psVar8;
      local_578._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_578._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_558 != &local_548) {
      operator_delete(local_558,local_548 + 1);
    }
    std::operator+(&local_518,"[",&local_578);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_518);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_548 = *plVar9;
      uStack_540 = (undefined4)plVar6[3];
      uStack_53c = *(undefined4 *)((long)plVar6 + 0x1c);
      local_558 = &local_548;
    }
    else {
      local_548 = *plVar9;
      local_558 = (long *)*plVar6;
    }
    local_550 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    xr_writer::w_sf((xr_writer *)this,(char *)local_558,&local_4f8);
    if (local_558 != &local_548) {
      operator_delete(local_558,local_548 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->m_section_stack).c,&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if (local_538 != &local_528) {
      operator_delete(local_538,CONCAT71(uStack_527,local_528) + 1);
    }
  }
  return;
}

Assistant:

void xr_ini_writer::open_section(std::string format, ...)
{
	va_list ap;
	va_start(ap, format);

	char buf[1024];
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(buf, sizeof(buf), format.c_str(), ap);
#else
	int n = vsnprintf(buf, sizeof(buf), format.c_str(), ap);
#endif
	va_end(ap);
	if (n == 0)
		return;

	std::string prev_section;
	if (m_section_stack.size() > 0)
		prev_section = m_section_stack.top() + "_";

	std::string section(prev_section + std::string(buf));

	w_sf(("[" + section + "]\n").c_str(), ap);

	m_section_stack.push(section);

	va_end(ap);
}